

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

int nn_req_crecv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)&self[0x37].sock;
  iVar2 = -0x9523dfe;
  if ((1 < iVar1 - 1U) && (iVar1 != 9)) {
    if (iVar1 == 8) {
      nn_msg_mv(msg,(nn_msg *)(self + 0x3f));
      iVar2 = 0;
      nn_msg_init((nn_msg *)(self + 0x3f),0);
      nn_fsm_action((nn_fsm *)(self + 0x32),5);
    }
    else {
      iVar2 = -0xb;
    }
  }
  return iVar2;
}

Assistant:

int nn_req_crecv (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  No request was sent. Waiting for a reply doesn't make sense. */
    if (nn_slow (!nn_req_inprogress (req)))
        return -EFSM;

    /*  If reply was not yet recieved, wait further. */
    if (nn_slow (req->state != NN_REQ_STATE_DONE))
        return -EAGAIN;

    /*  If the reply was already received, just pass it to the caller. */
    nn_msg_mv (msg, &req->task.reply);
    nn_msg_init (&req->task.reply, 0);

    /*  Notify the state machine. */
    nn_fsm_action (&req->fsm, NN_REQ_ACTION_RECEIVED);

    return 0;
}